

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O2

void cppurses::System::set_head(Widget *new_head)

{
  Widget *args;
  Area local_28;
  
  if (head_ != (Widget *)0x0) {
    (*head_->_vptr_Widget[2])(head_,0,1);
  }
  head_ = new_head;
  if (new_head != (Widget *)0x0) {
    (*new_head->_vptr_Widget[2])(new_head,1);
    args = head_;
    local_28.width = Terminal::width((Terminal *)terminal);
    local_28.height = Terminal::height((Terminal *)terminal);
    post_event<cppurses::Resize_event,cppurses::Widget&,cppurses::Area>(args,&local_28);
  }
  return;
}

Assistant:

void System::set_head(Widget* new_head)
{
    if (head_ != nullptr)
        head_->disable();
    head_ = new_head;
    if (head_ != nullptr) {
        head_->enable();
        post_event<Resize_event>(*head_,
                                 Area{terminal.width(), terminal.height()});
    }
}